

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O0

tuple<void_*,_unsigned_int> __thiscall MemPool::writeRecord(MemPool *this,uint recordSize)

{
  bool bVar1;
  undefined8 *puVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  MemPool *this_00;
  tuple<void_*,_unsigned_int> tVar3;
  uint recordSize_local;
  MemPool *this_local;
  tuple<void_*,_unsigned_int> *recordAddress;
  
  this_00 = (MemPool *)CONCAT44(in_register_00000034,recordSize);
  if (((this_00->blkSize < this_00->curBlkUsed + in_EDX) || (this_00->numAllocBlks == 0)) &&
     (bVar1 = allocBlk(this_00), !bVar1)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Unable to reserve space as no free space in blocks or no blocks can be allocated";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  if (in_EDX <= this_00->blkSize) {
    std::tuple<void_*,_unsigned_int>::tuple<unsigned_char_*&,_unsigned_int_&,_true>
              ((tuple<void_*,_unsigned_int> *)this,&this_00->blkPtr,&this_00->curBlkUsed);
    this_00->memPoolUsedRecords = in_EDX + this_00->memPoolUsedRecords;
    tVar3.super__Tuple_impl<0UL,_void_*,_unsigned_int>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl._0_4_ = in_EDX + this_00->curBlkUsed;
    this_00->curBlkUsed =
         (uint)tVar3.super__Tuple_impl<0UL,_void_*,_unsigned_int>.
               super__Head_base<0UL,_void_*,_false>._M_head_impl;
    tVar3.super__Tuple_impl<0UL,_void_*,_unsigned_int>._0_8_ = this;
    tVar3.super__Tuple_impl<0UL,_void_*,_unsigned_int>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl._4_4_ = 0;
    return (tuple<void_*,_unsigned_int>)tVar3.super__Tuple_impl<0UL,_void_*,_unsigned_int>;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Unable to reserve space as record size is greater than the block size";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

tuple<void * , uint> MemPool::writeRecord(uint recordSize) {

    if(blkSize < (curBlkUsed + recordSize) or numAllocBlks == 0){
        if (!allocBlk())
            throw "Unable to reserve space as no free space in blocks or no blocks can be allocated";
    }

    if (blkSize < recordSize) {
        throw "Unable to reserve space as record size is greater than the block size";
    }

    // Create a tuple for the address where the record is written <block address, relative offset>
    // The record can be accessed at the address (block address + relative offset)

    // void * pointer stores the address of the block, but in order to perform pointer arithmetic, this further needs
    // to be cast into uint or uchar pointer
    tuple<void * , uint> recordAddress(blkPtr, curBlkUsed);

    memPoolUsedRecords+=recordSize;
    curBlkUsed+=recordSize;

    return recordAddress;
}